

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  ma_vfs_callbacks *pCallbacks;
  undefined4 local_14;
  
  if (in_RDX == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,8);
    }
    if ((in_RDI == 0) || (in_RSI == 0)) {
      local_14 = MA_INVALID_ARGS;
    }
    else if (*(long *)(in_RDI + 0x38) == 0) {
      local_14 = MA_NOT_IMPLEMENTED;
    }
    else {
      local_14 = (**(code **)(in_RDI + 0x38))(in_RDI,in_RSI,in_RDX);
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onInfo == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onInfo(pVFS, file, pInfo);
}